

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O2

bool QResource::registerResource(QString *rccFilename,QString *resourceRoot)

{
  uchar *puVar1;
  QAtomicInt *pQVar2;
  bool bVar3;
  int iVar4;
  QChar *pQVar5;
  QDynamicBufferResourceRoot *this;
  void *__buf;
  void *pvVar6;
  uchar *b;
  ushort *puVar7;
  ushort *puVar8;
  QRecursiveMutex *this_00;
  ResourceList *this_01;
  size_t __nbytes;
  int __oflag;
  long in_FS_OFFSET;
  QMessageLogger local_98;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_70.d = (resourceRoot->d).d;
  local_70.ptr = (resourceRoot->d).ptr;
  local_70.size = (resourceRoot->d).size;
  if (local_70.d != (Data *)0x0) {
    LOCK();
    ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  qt_resource_fixResourceRoot((QString *)&local_58,(QString *)&local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  if (((undefined1 *)local_58.size == (undefined1 *)0x0) ||
     (pQVar5 = QString::data((QString *)&local_58), pQVar5->ucs == L'/')) {
    this = (QDynamicBufferResourceRoot *)operator_new(0x70);
    anon_unknown.dwarf_3f5684::QDynamicBufferResourceRoot::QDynamicBufferResourceRoot
              (this,(QString *)&local_58);
    (this->super_QResourceRoot)._vptr_QResourceRoot =
         (_func_int **)&PTR__QDynamicFileResourceRoot_00661f98;
    this[1].super_QResourceRoot.version = 0;
    this[1].super_QResourceRoot.ref = (QAtomicInteger<int>)0x0;
    this[1].super_QResourceRoot._vptr_QResourceRoot = (_func_int **)0x0;
    this[1].super_QResourceRoot.tree = (uchar *)0x0;
    this[1].super_QResourceRoot.names = (uchar *)0x0;
    this[1].super_QResourceRoot.payloads = (uchar *)0x0;
    local_98.context.version = -0x55555556;
    local_98.context.line = -0x55555556;
    local_98.context.file._0_4_ = 0xaaaaaaaa;
    local_98.context.file._4_4_ = 0xaaaaaaaa;
    QFile::QFile((QFile *)&local_98,rccFilename);
    iVar4 = QFile::open((QFile *)&local_98,(char *)0x1,__oflag);
    if ((char)iVar4 != '\0') {
      __buf = (void *)QFile::size((QFile *)&local_98);
      pvVar6 = __buf;
      if ((long)__buf < 0) {
        pvVar6 = (void *)(**(code **)(CONCAT44(local_98.context.line,local_98.context.version) +
                                     0x80))();
      }
      iVar4 = QFileDevice::handle((QFileDevice *)&local_98);
      __nbytes = 2;
      b = (uchar *)mmap64((void *)0x0,(size_t)pvVar6,1,2,iVar4,0);
      puVar1 = b + 1;
      if (puVar1 < (uchar *)0x2) {
        b = (uchar *)operator_new__((ulong)__buf);
        pvVar6 = (void *)QIODevice::read((QIODevice *)&local_98,(int)b,__buf,__nbytes);
        if (__buf != pvVar6) {
          operator_delete__(b);
          goto LAB_00237afc;
        }
      }
      bVar3 = anon_unknown.dwarf_3f5684::QDynamicBufferResourceRoot::registerSelf
                        (this,b,(qsizetype)__buf);
      if (bVar3) {
        if ((uchar *)0x1 < puVar1) {
          this[1].super_QResourceRoot.payloads = b;
          *(void **)&this[1].super_QResourceRoot.version = __buf;
        }
        QString::operator=((QString *)(this + 1),rccFilename);
        QFile::~QFile((QFile *)&local_98);
        LOCK();
        pQVar2 = &(this->super_QResourceRoot).ref;
        (pQVar2->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
        this_00 = resourceMutex();
        QRecursiveMutex::lock(this_00);
        this_01 = resourceList();
        QList<(anonymous_namespace)::QResourceRoot_*>::append(this_01,(parameter_type)this);
        QRecursiveMutex::unlock(this_00);
        bVar3 = true;
        goto LAB_00237b0f;
      }
    }
LAB_00237afc:
    QFile::~QFile((QFile *)&local_98);
    (*(this->super_QResourceRoot)._vptr_QResourceRoot[1])(this);
  }
  else {
    local_98.context.version = 2;
    local_98.context.function._4_4_ = 0;
    local_98.context.line = 0;
    local_98.context.file._0_4_ = 0;
    local_98.context.file._4_4_ = 0;
    local_98.context.function._0_4_ = 0;
    local_98.context.category = "default";
    puVar7 = QString::utf16(rccFilename);
    puVar8 = QString::utf16(resourceRoot);
    QMessageLogger::warning
              (&local_98,
               "QDir::registerResource: Registering a resource [%ls] must be rooted in an absolute path (start with /) [%ls]"
               ,puVar7,puVar8);
  }
  bVar3 = false;
LAB_00237b0f:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool QResource::registerResource(const QString &rccFilename, const QString &resourceRoot)
{
    QString r = qt_resource_fixResourceRoot(resourceRoot);
    if (!r.isEmpty() && r[0] != u'/') {
        qWarning("QDir::registerResource: Registering a resource [%ls] must be rooted in an "
                 "absolute path (start with /) [%ls]",
                 qUtf16Printable(rccFilename), qUtf16Printable(resourceRoot));
        return false;
    }

    QDynamicFileResourceRoot *root = new QDynamicFileResourceRoot(r);
    if (root->registerSelf(rccFilename)) {
        root->ref.ref();
        const auto locker = qt_scoped_lock(resourceMutex());
        resourceList()->append(root);
        return true;
    }
    delete root;
    return false;
}